

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::IncompleteTextureAccess::SamplerTest::Check(SamplerTest *this,Configuration configuration)

{
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar3;
  float fVar4;
  float fVar5;
  GLfloat result [4];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  result[0] = 7.0;
  result[1] = 7.0;
  result[2] = 7.0;
  result[3] = 7.0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))(0,0,1,1,0x1908,0x1406,result);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cIncompleteTextureAccessTests.cpp"
                  ,0x19c);
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 4) break;
    fVar4 = configuration.expected_result[uVar3] - result[uVar3];
    fVar5 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar5 = fVar4;
    }
    uVar1 = uVar3 + 1;
  } while (fVar5 <= 0.0125);
  return 3 < uVar3;
}

Assistant:

bool SamplerTest::Check(Configuration configuration)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return storage. */
	glw::GLfloat result[4] = { 7.f, 7.f, 7.f, 7.f };

	/* Fetch. */
	gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < 4 /* # components */; ++i)
	{
		if (de::abs(configuration.expected_result[i] - result[i]) > 0.0125 /* precision */)
		{
			/* Fail.*/
			return false;
		}
	}

	/* Comparsion passed.*/
	return true;
}